

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O2

void __thiscall
QFunctionJAOHTree::SetPU(QFunctionJAOHTree *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  DeInitialize(this);
  boost::shared_ptr<const_PlanningUnitDecPOMDPDiscrete>::operator=
            ((shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)
             ((long)&(this->super_QFunctionJAOH)._m_QValues.super_matrix_t.size1_ +
             *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88)),pu);
  return;
}

Assistant:

void QFunctionJAOHTree::SetPU(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu)
{
    DeInitialize();
    QFunctionJAOH::SetPU(pu);
}